

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O2

void pbrt::Log<unsigned_long,unsigned_long,unsigned_long,unsigned_long>
               (LogLevel level,char *file,int line,char *fmt,unsigned_long *args,
               unsigned_long *args_1,unsigned_long *args_2,unsigned_long *args_3)

{
  unsigned_long *in_stack_ffffffffffffffb8;
  string local_40;
  
  StringPrintf<unsigned_long,unsigned_long,unsigned_long,unsigned_long>
            (&local_40,(pbrt *)fmt,(char *)args,args_1,args_2,args_3,in_stack_ffffffffffffffb8);
  Log(level,file,line,local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

inline void Log(LogLevel level, const char *file, int line, const char *fmt,
                Args &&... args) {
#ifdef PBRT_IS_GPU_CODE
    Log(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    Log(level, file, line, s.c_str());
#endif
}